

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufAttrSerializeTxtContent(xmlBufPtr buf,xmlDocPtr doc,xmlAttrPtr attr,xmlChar *string)

{
  int iVar1;
  int iVar2;
  int local_4c;
  uint local_48;
  int l;
  int val;
  uchar tmp [12];
  xmlChar *cur;
  xmlChar *base;
  xmlChar *string_local;
  xmlAttrPtr attr_local;
  xmlDocPtr doc_local;
  xmlBufPtr buf_local;
  
  tmp._4_8_ = string;
  cur = string;
  if (string != (xmlChar *)0x0) {
LAB_00207260:
    iVar1 = (int)tmp._4_8_;
    iVar2 = (int)cur;
    if (*(char *)tmp._4_8_ != '\0') {
      if (*(char *)tmp._4_8_ == '\n') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&#10;",5);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
        goto LAB_00207260;
      }
      if (*(char *)tmp._4_8_ == '\r') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&#13;",5);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else if (*(char *)tmp._4_8_ == '\t') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&#9;",4);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else if (*(char *)tmp._4_8_ == '\"') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&quot;",6);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else if (*(char *)tmp._4_8_ == '<') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&lt;",4);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else if (*(char *)tmp._4_8_ == '>') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&gt;",4);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else if (*(char *)tmp._4_8_ == '&') {
        if (cur != (xmlChar *)tmp._4_8_) {
          xmlBufAdd(buf,cur,iVar1 - iVar2);
        }
        xmlBufAdd(buf,(xmlChar *)"&amp;",5);
        tmp._4_8_ = tmp._4_8_ + 1;
        cur = (xmlChar *)tmp._4_8_;
      }
      else {
        if (((0x7f < *(byte *)tmp._4_8_) && (*(char *)(tmp._4_8_ + 1) != '\0')) &&
           ((doc == (xmlDocPtr)0x0 || (doc->encoding == (xmlChar *)0x0)))) {
          local_48 = 0;
          local_4c = 1;
          if (cur != (xmlChar *)tmp._4_8_) {
            xmlBufAdd(buf,cur,iVar1 - iVar2);
          }
          if (*(byte *)tmp._4_8_ < 0xc0) {
            xmlSaveErr(0x578,(xmlNodePtr)attr,(char *)0x0);
            xmlSerializeHexCharRef((uchar *)&l,(uint)*(byte *)tmp._4_8_);
            xmlBufAdd(buf,(xmlChar *)&l,-1);
            tmp._4_8_ = tmp._4_8_ + 1;
            cur = (xmlChar *)tmp._4_8_;
            goto LAB_00207260;
          }
          if (*(byte *)tmp._4_8_ < 0xe0) {
            local_48 = *(byte *)(tmp._4_8_ + 1) & 0x3f | (*(byte *)tmp._4_8_ & 0x1f) << 6;
            local_4c = 2;
          }
          else if ((*(byte *)tmp._4_8_ < 0xf0) && (*(char *)(tmp._4_8_ + 2) != '\0')) {
            local_48 = *(byte *)(tmp._4_8_ + 2) & 0x3f |
                       (*(byte *)(tmp._4_8_ + 1) & 0x3f | (*(byte *)tmp._4_8_ & 0xf) << 6) << 6;
            local_4c = 3;
          }
          else if ((*(byte *)tmp._4_8_ < 0xf8) &&
                  ((*(char *)(tmp._4_8_ + 2) != '\0' && (*(char *)(tmp._4_8_ + 3) != '\0')))) {
            local_48 = *(byte *)(tmp._4_8_ + 3) & 0x3f |
                       (*(byte *)(tmp._4_8_ + 2) & 0x3f |
                       (*(byte *)(tmp._4_8_ + 1) & 0x3f | (*(byte *)tmp._4_8_ & 7) << 6) << 6) << 6;
            local_4c = 4;
          }
          if (local_4c != 1) {
            if (local_48 < 0x100) {
              if (((8 < local_48) && (local_48 < 0xb)) || ((local_48 == 0xd || (0x1f < local_48))))
              {
LAB_002077c4:
                xmlSerializeHexCharRef((uchar *)&l,local_48);
                xmlBufAdd(buf,(xmlChar *)&l,-1);
                tmp._4_8_ = tmp._4_8_ + (long)local_4c;
                cur = (xmlChar *)tmp._4_8_;
                goto LAB_00207260;
              }
            }
            else if ((((0xff < local_48) && (local_48 < 0xd800)) ||
                     ((0xdfff < local_48 && (local_48 < 0xfffe)))) ||
                    ((0xffff < local_48 && (local_48 < 0x110000)))) goto LAB_002077c4;
          }
          xmlSaveErr(0x579,(xmlNodePtr)attr,(char *)0x0);
          xmlSerializeHexCharRef((uchar *)&l,(uint)*(byte *)tmp._4_8_);
          xmlBufAdd(buf,(xmlChar *)&l,-1);
          tmp._4_8_ = tmp._4_8_ + 1;
          cur = (xmlChar *)tmp._4_8_;
          goto LAB_00207260;
        }
        tmp._4_8_ = tmp._4_8_ + 1;
      }
      goto LAB_00207260;
    }
    if (cur != (xmlChar *)tmp._4_8_) {
      xmlBufAdd(buf,cur,iVar1 - iVar2);
    }
  }
  return;
}

Assistant:

void
xmlBufAttrSerializeTxtContent(xmlBufPtr buf, xmlDocPtr doc,
                              xmlAttrPtr attr, const xmlChar * string)
{
    xmlChar *base, *cur;

    if (string == NULL)
        return;
    base = cur = (xmlChar *) string;
    while (*cur != 0) {
        if (*cur == '\n') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#10;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\r') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#13;", 5);
            cur++;
            base = cur;
        } else if (*cur == '\t') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&#9;", 4);
            cur++;
            base = cur;
        } else if (*cur == '"') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&quot;", 6);
            cur++;
            base = cur;
        } else if (*cur == '<') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&lt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '>') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&gt;", 4);
            cur++;
            base = cur;
        } else if (*cur == '&') {
            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            xmlBufAdd(buf, BAD_CAST "&amp;", 5);
            cur++;
            base = cur;
        } else if ((*cur >= 0x80) && (cur[1] != 0) &&
	           ((doc == NULL) || (doc->encoding == NULL))) {
            /*
             * We assume we have UTF-8 content.
             */
            unsigned char tmp[12];
            int val = 0, l = 1;

            if (base != cur)
                xmlBufAdd(buf, base, cur - base);
            if (*cur < 0xC0) {
                xmlSaveErr(XML_SAVE_NOT_UTF8, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            } else if (*cur < 0xE0) {
                val = (cur[0]) & 0x1F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                l = 2;
            } else if ((*cur < 0xF0) && (cur [2] != 0)) {
                val = (cur[0]) & 0x0F;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                l = 3;
            } else if ((*cur < 0xF8) && (cur [2] != 0) && (cur[3] != 0)) {
                val = (cur[0]) & 0x07;
                val <<= 6;
                val |= (cur[1]) & 0x3F;
                val <<= 6;
                val |= (cur[2]) & 0x3F;
                val <<= 6;
                val |= (cur[3]) & 0x3F;
                l = 4;
            }
            if ((l == 1) || (!IS_CHAR(val))) {
                xmlSaveErr(XML_SAVE_CHAR_INVALID, (xmlNodePtr) attr, NULL);
		xmlSerializeHexCharRef(tmp, *cur);
                xmlBufAdd(buf, (xmlChar *) tmp, -1);
                cur++;
                base = cur;
                continue;
            }
            /*
             * We could do multiple things here. Just save
             * as a char ref
             */
	    xmlSerializeHexCharRef(tmp, val);
            xmlBufAdd(buf, (xmlChar *) tmp, -1);
            cur += l;
            base = cur;
        } else {
            cur++;
        }
    }
    if (base != cur)
        xmlBufAdd(buf, base, cur - base);
}